

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_hton_u64_Test::TestBody(Buffer_change_event_add_hton_u64_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  AssertHelper local_1a0;
  Message local_198;
  allocator<bfy_changed_cb_info> local_189;
  bfy_changed_cb_info local_188;
  iterator local_168;
  size_type local_160;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_158;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  Message local_128;
  int local_120 [2];
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  bfy_changed_cb_info expected;
  unsigned_long size;
  uint64_t addme;
  BufferWithReadonlyStrings local;
  Buffer_change_event_add_hton_u64_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&addme);
  sVar2 = bfy_buffer_get_content_len((bfy_buffer *)&addme);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)&addme);
  local_120[1] = 0;
  local_120[0] = bfy_buffer_add_hton_u64((bfy_buffer *)&addme,0x80);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_118,"0","bfy_buffer_add_hton_u64(&local.buf, addme)",local_120 + 1,
             local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x596,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_188.n_deleted = 0;
  local_188.n_added = 8;
  local_168 = &local_188;
  local_160 = 1;
  local_188.orig_size = sVar2;
  std::allocator<bfy_changed_cb_info>::allocator(&local_189);
  __l._M_len = local_160;
  __l._M_array = local_168;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_158,__l,&local_189);
  testing::internal::EqHelper::
  Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
            ((EqHelper *)local_140,"changes_t{expected}","local.changes",&local_158,
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
             ((long)&local.allstrs.field_2 + 8));
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_158);
  std::allocator<bfy_changed_cb_info>::~allocator(&local_189);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x597,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&addme);
  return;
}

Assistant:

TEST(Buffer, change_event_add_hton_u64) {
    BufferWithReadonlyStrings local;
    auto constexpr addme = uint64_t { 128 };
    auto constexpr size = sizeof(addme);
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = size,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_hton_u64(&local.buf, addme));
    EXPECT_EQ(changes_t{expected}, local.changes);
}